

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O1

bool __thiscall
Kernel::ScanAndApplyFormulaUnitTransformer::apply
          (ScanAndApplyFormulaUnitTransformer *this,UnitList **units)

{
  List<Kernel::Unit_*> *pLVar1;
  int iVar2;
  UnitList *pUVar3;
  List<Kernel::Unit_*> **ppLVar4;
  UnitList *pUVar5;
  bool bVar6;
  List<Kernel::Unit_*> **ppLVar7;
  bool bVar8;
  DelIterator uit;
  Unit *newUnit;
  DelIterator local_48;
  Unit *local_30;
  undefined4 extraout_var;
  
  (*this->_vptr_ScanAndApplyFormulaUnitTransformer[2])(this,*units);
  local_48._prev = (List<Kernel::Unit_*> *)0x0;
  local_48._cur = (List<Kernel::Unit_*> *)0x0;
  ppLVar4 = (List<Kernel::Unit_*> **)&DAT_00000008;
  bVar8 = true;
  local_48._lst = units;
  if (*units == (UnitList *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = false;
    local_48._cur = (List<Kernel::Unit_*> *)0x0;
    do {
      ppLVar7 = local_48._lst;
      if (!bVar8) {
        ppLVar7 = ppLVar4;
        local_48._prev = local_48._cur;
      }
      local_48._cur = *ppLVar7;
      iVar2 = (*this->_vptr_ScanAndApplyFormulaUnitTransformer
                [(ulong)(((local_48._cur)->_head->field_0x4 & 1) == 0) + 4])
                        (this,(local_48._cur)->_head,&local_30);
      if ((char)iVar2 != '\0') {
        if (local_30 == (Unit *)0x0) {
          ::Lib::List<Kernel::Unit_*>::DelIterator::del(&local_48);
        }
        else {
          (local_48._cur)->_head = local_30;
        }
        bVar6 = true;
      }
      ppLVar4 = &(local_48._cur)->_tail;
      bVar8 = local_48._cur == (List<Kernel::Unit_*> *)0x0;
      ppLVar7 = ppLVar4;
      if (bVar8) {
        ppLVar7 = local_48._lst;
      }
    } while (*ppLVar7 != (UnitList *)0x0);
  }
  iVar2 = (*this->_vptr_ScanAndApplyFormulaUnitTransformer[3])(this);
  pUVar3 = (UnitList *)CONCAT44(extraout_var,iVar2);
  pLVar1 = pUVar3;
  if (pUVar3 != (UnitList *)0x0) {
    do {
      pUVar5 = pLVar1;
      pLVar1 = pUVar5->_tail;
    } while (pLVar1 != (List<Kernel::Unit_*> *)0x0);
    if (local_48._prev != (List<Kernel::Unit_*> *)0x0) {
      local_48._lst = &(local_48._prev)->_tail;
    }
    *local_48._lst = pUVar3;
    pUVar5->_tail = local_48._cur;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool ScanAndApplyFormulaUnitTransformer::apply(UnitList*& units)
{
  scan(units);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    Unit* newUnit;

    if(!apply(u, newUnit)) {
      continue;
    }
    if(newUnit==0) {
      uit.del();
    }
    else {
      uit.replace(newUnit);
    }
    modified = true;
  }

  UnitList* added = getIntroducedFormulas();
  if(added) {
    modified = true;
    uit.insert(added);
  }

  return modified;
}